

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O3

void CVmObjBigNum::calc_asincos_into(char *dst,char *src,int is_acos)

{
  byte bVar1;
  ushort uVar2;
  char *src_00;
  err_frame_t *peVar3;
  CVmException *pCVar4;
  int iVar5;
  char *pcVar6;
  long *in_FS_OFFSET;
  bool bVar7;
  char *ext1;
  char *ext2;
  char *ext3;
  char *ext4;
  int local_140;
  uint hdl5;
  uint hdl4;
  uint hdl3;
  uint hdl2;
  uint hdl1;
  char *local_128;
  char *local_120;
  char *ext5;
  err_frame_t err_cur__;
  
  uVar2 = *(ushort *)dst;
  local_140 = is_acos;
  local_120 = dst;
  local_128 = cache_pi((ulong)uVar2 + 3);
  alloc_temp_regs((ulong)uVar2 + 3,5,&ext1,&hdl1,&ext2,&hdl2,&ext3,&hdl3,&ext4,&hdl4,&ext5,&hdl5);
  G_err_frame::__tls_init();
  err_cur__.prv_ = (err_frame_t *)*in_FS_OFFSET;
  G_err_frame::__tls_init();
  *in_FS_OFFSET = (long)&err_cur__;
  err_cur__.state_ = _setjmp((__jmp_buf_tag *)err_cur__.jmpbuf_);
  if (err_cur__.state_ == 0) {
    bVar7 = false;
    copy_val(ext1,src,0);
    copy_val(ext2,(char *)"\x01",0);
    iVar5 = compare_abs(ext1,ext2);
    if (0 < iVar5) {
      err_throw(0x7eb);
    }
    copy_val(ext2,(char *)"\n",1);
    iVar5 = compare_abs(ext1,ext2);
    if (0 < iVar5) {
      bVar1 = ext1[4];
      compute_prod_into(ext2,ext1,ext1);
      copy_val(ext3,(char *)"\x01",0);
      if ((ext2[4] & 8U) == 0) {
        ext2[4] = ext2[4] | 1;
      }
      compute_sum_into(ext4,ext3,ext2);
      compute_sqrt_into(ext1,ext4);
      bVar7 = (bVar1 & 1) == 0;
    }
    src_00 = local_128;
    pcVar6 = calc_asin_series(ext1,ext2,ext3,ext4,ext5);
    if (0 < iVar5) {
      ext1 = pcVar6;
      copy_val(ext2,src_00,1);
      div_by_long(ext2,2,(unsigned_long *)0x0);
      if ((ext1[4] & 8U) == 0) {
        ext1[4] = ext1[4] ^ 1;
      }
      compute_sum_into(ext3,ext2,ext1);
      pcVar6 = ext3;
      if ((!bVar7) && ((ext3[4] & 8U) == 0)) {
        ext3[4] = ext3[4] ^ 1;
      }
      ext3 = ext1;
    }
    ext1 = pcVar6;
    if (local_140 != 0) {
      copy_val(ext2,src_00,1);
      div_by_long(ext2,2,(unsigned_long *)0x0);
      if ((ext1[4] & 8U) == 0) {
        ext1[4] = ext1[4] ^ 1;
      }
      compute_sum_into(ext3,ext2,ext1);
      pcVar6 = ext3;
      ext3 = ext1;
      ext1 = pcVar6;
    }
    copy_val(local_120,ext1,1);
  }
  if (-1 < (short)err_cur__.state_) {
    err_cur__.state_ = err_cur__.state_ | 0x8000;
    release_temp_regs(5,(ulong)hdl1,(ulong)hdl2,(ulong)hdl3,(ulong)hdl4,(ulong)hdl5);
  }
  peVar3 = err_cur__.prv_;
  G_err_frame::__tls_init();
  *in_FS_OFFSET = (long)peVar3;
  if ((err_cur__.state_ & 0x4001U) != 0) {
    G_err_frame::__tls_init();
    if ((*(byte *)*in_FS_OFFSET & 2) != 0) {
      G_err_frame::__tls_init();
      free(*(void **)(*in_FS_OFFSET + 0x10));
    }
    pCVar4 = err_cur__.exc_;
    G_err_frame::__tls_init();
    *(CVmException **)(*in_FS_OFFSET + 0x10) = pCVar4;
    err_rethrow();
  }
  if ((err_cur__.state_ & 2U) != 0) {
    free(err_cur__.exc_);
  }
  return;
}

Assistant:

void CVmObjBigNum::calc_asincos_into(char *dst, const char *src,
                                     int is_acos)
{
    size_t prec = get_prec(dst);
    uint hdl1, hdl2, hdl3, hdl4, hdl5;
    char *ext1, *ext2, *ext3, *ext4, *ext5;
    const char *pi;

    /* cache pi to our working precision */
    pi = cache_pi(prec + 3);

    /* 
     *   allocate our temporary registers - use some extra precision over
     *   what we need for the result, to reduce the effect of accumulated
     *   rounding error 
     */
    alloc_temp_regs(prec + 3, 5,
                    &ext1, &hdl1, &ext2, &hdl2, &ext3, &hdl3,
                    &ext4, &hdl4, &ext5, &hdl5);

    /* catch errors so we release our temp registers */
    err_try
    {
        char *tmp;
        static const unsigned char one_over_sqrt2[] =
        {
            /* precision = 10, scale = 0, flags = 0 */
            10, 0, 0, 0, 0,
            0x70, 0x71, 0x06, 0x78, 0x14
        };
        int use_sqrt;
        int sqrt_neg;
        
        /* get the initial value of x into our accumulator, r1 */
        copy_val(ext1, src, FALSE);

        /* 
         *   check to see if the absolute value of the argument is greater
         *   than 1 - if it is, it's not valid 
         */
        copy_val(ext2, get_one(), FALSE);
        if (compare_abs(ext1, ext2) > 0)
            err_throw(VMERR_OUT_OF_RANGE);

        /* presume we won't need to use the sqrt(1-x^2) method */
        use_sqrt = FALSE;

        /*
         *   Check to see if the absolute value of the argument is greater
         *   than 1/sqrt(2).  If it is, the series expansion converges too
         *   slowly (as slowly as never, if the value is exactly 1).  To
         *   speed things up, in these cases calculate pi/2 -
         *   asin(sqrt(1-x^2)) instead, which is equivalent but gives us a
         *   smaller asin() argument for quicker series convergence.
         *   
         *   We don't need to compare to 1/sqrt(2) in great precision;
         *   just use a few digits.  
         */
        copy_val(ext2, (const char *)one_over_sqrt2, TRUE);
        if (compare_abs(ext1, ext2) > 0)
        {
            /* flag that we're using the sqrt method */
            use_sqrt = TRUE;
            
            /* note the sign - we'll need to apply this to the result */
            sqrt_neg = get_neg(ext1);

            /* compute x^2 into r2 */
            compute_prod_into(ext2, ext1, ext1);

            /* subtract r2 from 1 (by adding -r2 to 1), storing in r4 */
            copy_val(ext3, get_one(), FALSE);
            make_negative(ext2);
            compute_sum_into(ext4, ext3, ext2);

            /* compute sqrt(1-x^2) (which is sqrt(r4)) into r1 */
            compute_sqrt_into(ext1, ext4);
        }

        /* compute the arcsine */
        ext1 = calc_asin_series(ext1, ext2, ext3, ext4, ext5);

        /* if we're using the sqrt method, finish the sqrt calculation */
        if (use_sqrt)
        {
            /* calculate pi/2 */
            copy_val(ext2, pi, TRUE);
            div_by_long(ext2, 2);

            /* compute pi/2 - r1 by negating r1 and adding it */
            negate(ext1);
            compute_sum_into(ext3, ext2, ext1);

            /* negate the result if the original value was negative */
            if (sqrt_neg)
                negate(ext3);

            /* swap the result back into r1 */
            tmp = ext1;
            ext1 = ext3;
            ext3 = tmp;
        }

        /* 
         *   We now have the arcsine in r1.  If we actually wanted the
         *   arccosine, subtract the arcsine from pi/2 to yield the
         *   arccosine.  
         */
        if (is_acos)
        {
            /* get pi/2 into r2 */
            copy_val(ext2, pi, TRUE);
            div_by_long(ext2, 2);
            
            /* negate r1 to get -asin */
            negate(ext1);
            
            /* add -asin to r2 to yield the arccosine in r3 */
            compute_sum_into(ext3, ext2, ext1);
            
            /* swap the result back into ext1 */
            tmp = ext3;
            ext3 = ext1;
            ext1 = tmp;
        }

        /* store the result, rounding if necessary */
        copy_val(dst, ext1, TRUE);
    }